

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O2

Num * __thiscall Num::multiplyByPowerOfTen(Num *__return_storage_ptr__,Num *this,Short length)

{
  Num(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->base);
  std::__cxx11::string::append((ulong)&__return_storage_ptr__->base,(char)length);
  __return_storage_ptr__->size = (Short)(__return_storage_ptr__->base)._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

Num Num::multiplyByPowerOfTen(Short length) const // function of multiplication a number by certain power of ten
{
    Num res;
    res.base = base;
    res.base.append(length, '0');
    res.size = res.getSize();
    return res;
}